

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  ulong *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  ulong uVar13;
  parasail_result_t *ppVar14;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *__dest;
  __m128i *__dest_00;
  __m128i *__dest_01;
  __m128i *__dest_02;
  __m128i *ptr;
  __m128i *ptr_00;
  long lVar15;
  size_t __n;
  int iVar16;
  int iVar17;
  size_t len;
  size_t len_00;
  long lVar18;
  ulong uVar19;
  longlong lVar20;
  uint uVar21;
  int iVar22;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong lVar23;
  int iVar24;
  longlong lVar25;
  long lVar26;
  __m128i *palVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 uVar50;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i_64_t B_6;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i_64_t A;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i_64_t B_1;
  undefined1 auVar61 [16];
  long lVar62;
  long lVar65;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  __m128i_64_t B_4;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  long lVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  long lVar78;
  ulong uVar79;
  __m128i_64_t B_3;
  ulong uVar82;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  __m128i_64_t B;
  undefined1 auVar88 [16];
  ulong uVar89;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i_64_t B_8;
  int local_22c;
  long local_208;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  long local_178;
  long local_170;
  undefined1 local_168 [16];
  ulong uStack_150;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_88 [16];
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_stats_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar30 = profile->s1Len;
        uVar13 = (ulong)uVar30;
        if ((int)uVar30 < 1) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_1();
        }
        else {
          uVar29 = uVar13 + 1;
          pvVar5 = (profile->profile64).matches;
          iVar16 = ppVar4->min;
          uVar32 = 0x8000000000000000 - (long)iVar16;
          if (iVar16 != -open && SBORROW4(iVar16,-open) == iVar16 + open < 0) {
            uVar32 = (ulong)(uint)open | 0x8000000000000000;
          }
          pvVar6 = (profile->profile64).similar;
          iVar16 = ppVar4->max;
          local_1b8._8_8_ = local_1b8._0_8_;
          local_1b8._0_8_ = (long)iVar16;
          ppVar14 = parasail_result_new_table3((uint)uVar29 & 0x7ffffffe,s2Len);
          if (ppVar14 != (parasail_result_t *)0x0) {
            uVar31 = uVar29 >> 1;
            ppVar14->flag = ppVar14->flag | 0x2830404;
            b = parasail_memalign___m128i(0x10,uVar31);
            b_00 = parasail_memalign___m128i(0x10,uVar31);
            b_01 = parasail_memalign___m128i(0x10,uVar31);
            b_02 = parasail_memalign___m128i(0x10,uVar31);
            b_03 = parasail_memalign___m128i(0x10,uVar31);
            b_04 = parasail_memalign___m128i(0x10,uVar31);
            b_05 = parasail_memalign___m128i(0x10,uVar31);
            b_06 = parasail_memalign___m128i(0x10,uVar31);
            __dest = parasail_memalign___m128i(0x10,uVar31);
            __dest_00 = parasail_memalign___m128i(0x10,uVar31);
            __dest_01 = parasail_memalign___m128i(0x10,uVar31);
            __dest_02 = parasail_memalign___m128i(0x10,uVar31);
            ptr = parasail_memalign___m128i(0x10,uVar31);
            ptr_00 = parasail_memalign___m128i(0x10,uVar31);
            auVar34._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar34._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar55._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar55._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar34 = packssdw(auVar34,auVar55);
            auVar66._0_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar66._8_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar80._0_8_ = -(ulong)(b_05 == (__m128i *)0x0);
            auVar80._8_8_ = -(ulong)(b_06 == (__m128i *)0x0);
            auVar55 = packssdw(auVar66,auVar80);
            auVar34 = packssdw(auVar34,auVar55);
            if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar34[0xf] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (__dest == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar33 = (ulong)(uint)gap;
            lVar15 = uVar32 + 1;
            len = 0x7ffffffffffffffe - (long)iVar16;
            auVar35._8_4_ = (int)lVar15;
            auVar35._0_8_ = lVar15;
            auVar35._12_4_ = (int)((ulong)lVar15 >> 0x20);
            uVar50 = (undefined4)(len >> 0x20);
            local_128._8_4_ = (int)len;
            local_128._0_8_ = len;
            local_128._12_4_ = uVar50;
            c[1] = (longlong)b;
            c[0] = uVar31;
            len_00 = len;
            parasail_memset___m128i(b_03,c,len);
            c_00[1] = extraout_RDX;
            c_00[0] = uVar31;
            parasail_memset___m128i(b_04,c_00,len_00);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar31;
            parasail_memset___m128i(b_05,c_01,len_00);
            c_02[1] = extraout_RDX_01;
            c_02[0] = uVar31;
            parasail_memset___m128i(b_06,c_02,len_00);
            c_03[1] = extraout_RDX_02;
            c_03[0] = uVar31;
            parasail_memset___m128i(b,c_03,len_00);
            c_04[1] = extraout_RDX_03;
            c_04[0] = uVar31;
            parasail_memset___m128i(b_00,c_04,len_00);
            c_05[1] = extraout_RDX_04;
            c_05[0] = uVar31;
            parasail_memset___m128i(b_01,c_05,len_00);
            c_06[1] = extraout_RDX_05;
            c_06[0] = uVar31;
            parasail_memset___m128i(b_02,c_06,len_00);
            uStack_150 = (ulong)(uint)gap;
            uVar7 = (uint)uVar31;
            uVar11 = uVar7 - 1;
            lVar62 = -(ulong)(uint)open;
            lVar65 = -(ulong)(uint)open;
            lVar18 = (ulong)uVar11 << 4;
            auVar36 = pmovsxbq(extraout_XMM0,0x101);
            auVar81._8_4_ = 0xffffffff;
            auVar81._0_8_ = 0xffffffffffffffff;
            auVar81._12_4_ = 0xffffffff;
            uVar19 = uVar31;
            do {
              plVar1 = (long *)((long)*ptr + lVar18);
              *plVar1 = lVar62;
              plVar1[1] = lVar65;
              *(undefined1 (*) [16])((long)*ptr_00 + lVar18) = auVar36;
              lVar62 = lVar62 - uVar33;
              lVar65 = lVar65 - uStack_150;
              lVar26 = auVar36._8_8_;
              auVar36._0_8_ = auVar36._0_8_ + 1;
              auVar36._8_8_ = lVar26 - auVar81._8_8_;
              lVar18 = lVar18 + -0x10;
              iVar16 = (int)uVar19;
              uVar21 = iVar16 - 1;
              uVar19 = (ulong)uVar21;
            } while (uVar21 != 0 && 0 < iVar16);
            __n = uVar31 << 4;
            uVar19 = (ulong)(uint)s2Len;
            lVar62 = (ulong)(uVar7 + (uVar7 == 0)) << 4;
            local_170 = uVar31 * uVar19 * 4;
            local_178 = 0;
            uVar31 = 0;
            local_22c = 0;
            auVar34 = auVar35;
            local_208 = lVar15;
            local_168 = auVar35;
            local_88 = auVar35;
            do {
              lVar18 = (long)(int)(ppVar4->mapper[(byte)s2[uVar31]] * uVar7) * 0x10;
              lStack_50 = b_06[uVar11][0];
              local_58 = 0;
              lStack_40 = b_05[uVar11][0];
              local_48 = 0;
              lVar26 = 0;
              auVar66 = ZEXT816(0);
              local_1d8 = ZEXT816(0);
              local_1c8 = ZEXT816(0);
              uStack_130 = auVar35._8_8_;
              local_1e8._8_8_ = uStack_130;
              local_1e8._0_8_ = lVar15;
              uVar79 = 0;
              uVar82 = 0;
              auVar55 = local_108;
              local_108._0_8_ = 0;
              local_108._8_8_ = b_04[uVar11][0];
              lVar65 = 0;
              lVar20 = b_03[uVar11][0];
              do {
                plVar1 = (long *)((long)*b_03 + lVar26);
                lVar74 = *plVar1;
                lVar78 = plVar1[1];
                auVar80 = *(undefined1 (*) [16])((long)*b_04 + lVar26);
                auVar36 = *(undefined1 (*) [16])((long)*b_05 + lVar26);
                plVar1 = (long *)((long)*b + lVar26);
                auVar86._0_8_ = lVar74 - (ulong)(uint)open;
                auVar86._8_8_ = lVar78 - (ulong)(uint)open;
                uStack_150 = (ulong)(uint)gap;
                auVar88._0_8_ = *plVar1 - uVar33;
                auVar88._8_8_ = plVar1[1] - uStack_150;
                auVar56._0_8_ = -(ulong)(auVar88._0_8_ < auVar86._0_8_);
                auVar56._8_8_ = -(ulong)(auVar88._8_8_ < auVar86._8_8_);
                auVar85 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar26),auVar80,auVar56);
                auVar75 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar26),auVar36,auVar56);
                auVar81 = *(undefined1 (*) [16])((long)*b_06 + lVar26);
                auVar83 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar26),auVar81,auVar56);
                plVar1 = (long *)((long)*ptr + lVar26);
                auVar61._0_8_ = uVar79 + *plVar1;
                auVar61._8_8_ = uVar82 + plVar1[1];
                auVar37._0_8_ = -(ulong)(local_1e8._0_8_ < auVar61._0_8_);
                auVar37._8_8_ = -(ulong)(local_1e8._8_8_ < auVar61._8_8_);
                local_1e8 = blendvpd(local_1e8,auVar61,auVar37);
                local_1c8 = blendvpd(local_1c8,auVar55,auVar37);
                local_1d8 = blendvpd(local_1d8,local_1b8,auVar37);
                plVar1 = (long *)((long)*ptr_00 + lVar26);
                auVar87._0_8_ = local_f8._0_8_ + *plVar1;
                auVar87._8_8_ = local_f8._8_8_ + plVar1[1];
                auVar66 = blendvpd(auVar66,auVar87,auVar37);
                auVar38._8_4_ = 0xffffffff;
                auVar38._0_8_ = 0xffffffffffffffff;
                auVar38._12_4_ = 0xffffffff;
                auVar84._0_8_ = auVar83._0_8_ + 1;
                auVar84._8_8_ = auVar83._8_8_ - auVar38._8_8_;
                plVar1 = (long *)((long)pvVar3 + lVar26 + lVar18);
                uVar79 = lVar65 + *plVar1;
                uVar82 = lVar20 + plVar1[1];
                plVar1 = (long *)((long)pvVar5 + lVar26 + lVar18);
                auVar72._0_8_ = local_108._0_8_ + *plVar1;
                auVar72._8_8_ = local_108._8_8_ + plVar1[1];
                plVar1 = (long *)((long)pvVar6 + lVar26 + lVar18);
                auVar69._0_8_ = local_48 + *plVar1;
                auVar69._8_8_ = lStack_40 + plVar1[1];
                auVar63._0_8_ = local_58 + 1;
                auVar63._8_8_ = lStack_50 - auVar38._8_8_;
                auVar55 = blendvpd(auVar88,auVar86,auVar56);
                uVar28 = auVar55._0_8_;
                uVar89 = auVar55._8_8_;
                *(undefined1 (*) [16])((long)*b + lVar26) = auVar55;
                auVar83._0_8_ = -(ulong)((long)uVar79 < (long)uVar28);
                auVar83._8_8_ = -(ulong)((long)uVar82 < (long)uVar89);
                auVar55 = blendvpd(auVar72,auVar85,auVar83);
                local_1b8 = blendvpd(auVar69,auVar75,auVar83);
                local_f8 = blendvpd(auVar63,auVar84,auVar83);
                *(undefined1 (*) [16])((long)*b_00 + lVar26) = auVar85;
                *(undefined1 (*) [16])((long)*b_01 + lVar26) = auVar75;
                *(undefined1 (*) [16])((long)*b_02 + lVar26) = auVar84;
                puVar2 = (ulong *)((long)*b_03 + lVar26);
                *puVar2 = uVar79;
                puVar2[1] = uVar82;
                if ((long)uVar79 < (long)uVar28) {
                  uVar79 = uVar28;
                }
                *(undefined1 (*) [16])((long)*b_04 + lVar26) = auVar72;
                *(undefined1 (*) [16])((long)*b_05 + lVar26) = auVar69;
                if ((long)uVar82 < (long)uVar89) {
                  uVar82 = uVar89;
                }
                *(undefined1 (*) [16])((long)*b_06 + lVar26) = auVar63;
                lVar26 = lVar26 + 0x10;
                local_58 = auVar81._0_8_;
                lStack_50 = auVar81._8_8_;
                local_48 = auVar36._0_8_;
                lStack_40 = auVar36._8_8_;
                local_108._0_8_ = auVar80._0_8_;
                local_108._8_8_ = auVar80._8_8_;
                lVar65 = lVar74;
                lVar20 = lVar78;
              } while (lVar62 != lVar26);
              auVar75._8_8_ = 0;
              auVar75._0_8_ = auVar55._0_8_;
              local_108 = auVar75 << 0x40;
              auVar85._8_8_ = 0;
              auVar85._0_8_ = local_1b8._0_8_;
              local_1b8 = auVar85 << 0x40;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = local_f8._0_8_;
              local_f8 = auVar8 << 0x40;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar79;
              lVar65 = (*ptr)[0];
              auVar51._0_8_ = -(ulong)(lVar65 < (long)local_1e8._0_8_);
              auVar51._8_8_ = -(ulong)((long)((*ptr)[1] + uVar79) < (long)local_1e8._8_8_);
              auVar55 = blendvpd((undefined1  [16])*ptr_00,auVar66,auVar51);
              if (lVar65 < (long)local_1e8._0_8_) {
                lVar65 = local_1e8._0_8_;
              }
              auVar10._8_8_ = 0;
              auVar10._0_8_ = auVar55._0_8_;
              auVar64 = auVar10 << 0x40;
              auVar68._8_8_ = lVar65;
              auVar68._0_8_ = lVar15;
              auVar57._0_8_ = -(ulong)(0 < lVar15);
              auVar57._8_8_ = -(ulong)((long)uVar79 < lVar65);
              auVar66 = blendvpd(local_f8,auVar64,auVar57);
              auVar55 = blendvpd(local_1b8,local_1d8,auVar51);
              auVar70._8_8_ = 0;
              auVar70._0_8_ = auVar55._0_8_;
              auVar70 = auVar70 << 0x40;
              auVar80 = blendvpd(local_1b8,auVar70,auVar57);
              auVar55 = blendvpd(local_108,local_1c8,auVar51);
              auVar71._8_8_ = 0;
              auVar71._0_8_ = auVar55._0_8_;
              auVar71 = auVar71 << 0x40;
              auVar55 = blendvpd(local_108,auVar71,auVar57);
              auVar76 = blendvpd(auVar9 << 0x40,auVar68,auVar57);
              lVar26 = 0;
              lVar65 = local_178;
              lVar18 = local_170;
              do {
                auVar77._0_8_ = auVar76._0_8_ - (ulong)(uint)open;
                auVar77._8_8_ = auVar76._8_8_ - (ulong)(uint)open;
                auVar67._0_8_ = auVar68._0_8_ - uVar33;
                auVar67._8_8_ = auVar68._8_8_ - uStack_150;
                auVar39._0_8_ = -(ulong)(auVar67._0_8_ < auVar77._0_8_);
                auVar39._8_8_ = -(ulong)(auVar67._8_8_ < auVar77._8_8_);
                auVar71 = blendvpd(auVar71,auVar55,auVar39);
                auVar55 = *(undefined1 (*) [16])((long)*b_03 + lVar26);
                auVar70 = blendvpd(auVar70,auVar80,auVar39);
                auVar80 = *(undefined1 (*) [16])((long)*b + lVar26);
                auVar36 = blendvpd(auVar64,auVar66,auVar39);
                auVar68 = blendvpd(auVar67,auVar77,auVar39);
                auVar58._0_8_ = -(ulong)(auVar80._0_8_ < auVar55._0_8_);
                auVar58._8_8_ = -(ulong)(auVar80._8_8_ < auVar55._8_8_);
                auVar80 = blendvpd(auVar80,auVar55,auVar58);
                auVar40._0_8_ = -(ulong)(auVar68._0_8_ < auVar80._0_8_);
                auVar40._8_8_ = -(ulong)(auVar68._8_8_ < auVar80._8_8_);
                auVar81 = blendvpd(auVar68,auVar80,auVar40);
                auVar76._0_8_ = -(ulong)(0 < auVar81._0_8_);
                auVar76._8_8_ = -(ulong)(0 < auVar81._8_8_);
                auVar76 = auVar76 & auVar81;
                lVar74 = auVar76._0_8_;
                auVar52._0_8_ = -(ulong)(auVar55._0_8_ == lVar74);
                lVar78 = auVar76._8_8_;
                auVar52._8_8_ = -(ulong)(auVar55._8_8_ == lVar78);
                auVar59._0_8_ = -(ulong)(lVar74 == auVar68._0_8_);
                auVar59._8_8_ = -(ulong)(lVar78 == auVar68._8_8_);
                auVar55 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar26),auVar71,auVar59);
                auVar55 = blendvpd(auVar55,*(undefined1 (*) [16])((long)*b_04 + lVar26),auVar52);
                auVar80 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar26),auVar70,auVar59);
                auVar80 = blendvpd(auVar80,*(undefined1 (*) [16])((long)*b_05 + lVar26),auVar52);
                auVar66 = pmovsxbq(auVar66,0x101);
                auVar73._0_8_ = -(ulong)(auVar81._0_8_ < auVar66._0_8_);
                auVar73._8_8_ = -(ulong)(auVar81._8_8_ < auVar66._8_8_);
                auVar64._0_8_ = auVar36._0_8_ + 1;
                auVar64._8_8_ = auVar36._8_8_ + 1;
                auVar66 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar26),auVar64,auVar59);
                auVar66 = blendvpd(auVar66,*(undefined1 (*) [16])((long)*b_06 + lVar26),auVar52);
                auVar41._0_8_ = -(ulong)(local_128._0_8_ < lVar74);
                auVar41._8_8_ = -(ulong)(local_128._8_8_ < lVar78);
                local_128 = blendvpd(auVar76,local_128,auVar41);
                auVar55 = ~auVar73 & auVar55;
                auVar42._0_8_ = -(ulong)(lVar74 < local_168._0_8_);
                auVar42._8_8_ = -(ulong)(lVar78 < local_168._8_8_);
                auVar36 = blendvpd(auVar76,local_168,auVar42);
                auVar80 = ~auVar73 & auVar80;
                auVar43._0_8_ = -(ulong)(auVar55._0_8_ < auVar36._0_8_);
                auVar43._8_8_ = -(ulong)(auVar55._8_8_ < auVar36._8_8_);
                auVar36 = blendvpd(auVar55,auVar36,auVar43);
                auVar44._0_8_ = -(ulong)(auVar80._0_8_ < auVar36._0_8_);
                auVar44._8_8_ = -(ulong)(auVar80._8_8_ < auVar36._8_8_);
                auVar36 = blendvpd(auVar80,auVar36,auVar44);
                auVar66 = ~auVar73 & auVar66;
                auVar45._0_8_ = -(ulong)(auVar66._0_8_ < auVar36._0_8_);
                auVar45._8_8_ = -(ulong)(auVar66._8_8_ < auVar36._8_8_);
                local_168 = blendvpd(auVar66,auVar36,auVar45);
                auVar46._0_8_ = -(ulong)(auVar34._0_8_ < lVar74);
                auVar46._8_8_ = -(ulong)(auVar34._8_8_ < lVar78);
                auVar34 = blendvpd(auVar34,auVar76,auVar46);
                *(undefined1 (*) [16])((long)*b_03 + lVar26) = auVar76;
                *(undefined1 (*) [16])((long)*b_04 + lVar26) = auVar55;
                *(undefined1 (*) [16])((long)*b_05 + lVar26) = auVar80;
                *(undefined1 (*) [16])((long)*b_06 + lVar26) = auVar66;
                lVar74 = *((ppVar14->field_4).trace)->trace_del_table;
                *(int *)(lVar74 + lVar65) = auVar76._0_4_;
                *(int *)(lVar74 + lVar18) = auVar76._8_4_;
                lVar74 = *(long *)((long)((ppVar14->field_4).trace)->trace_del_table + 8);
                *(int *)(lVar74 + lVar65) = auVar55._0_4_;
                *(int *)(lVar74 + lVar18) = auVar55._8_4_;
                lVar74 = *(long *)((long)((ppVar14->field_4).trace)->trace_del_table + 0x10);
                *(int *)(lVar74 + lVar65) = auVar80._0_4_;
                *(int *)(lVar74 + lVar18) = auVar80._8_4_;
                palVar27 = *(__m128i **)((long)((ppVar14->field_4).trace)->trace_del_table + 0x18);
                *(int *)((long)*palVar27 + lVar65) = auVar66._0_4_;
                *(int *)((long)*palVar27 + lVar18) = auVar66._8_4_;
                lVar26 = lVar26 + 0x10;
                lVar18 = lVar18 + uVar19 * 4;
                lVar65 = lVar65 + uVar19 * 4;
              } while (lVar62 != lVar26);
              lVar18 = auVar34._0_8_;
              lVar26 = auVar34._8_8_;
              auVar47._0_8_ = -(ulong)((long)local_88._0_8_ < lVar18);
              auVar47._8_8_ = -(ulong)((long)local_88._8_8_ < lVar26);
              iVar16 = movmskpd((int)lVar65,auVar47);
              if (iVar16 != 0) {
                local_208 = lVar26;
                if (lVar26 < lVar18) {
                  local_208 = lVar18;
                }
                local_88._8_4_ = (int)local_208;
                local_88._0_8_ = local_208;
                local_88._12_4_ = (int)((ulong)local_208 >> 0x20);
                memcpy(__dest,b_03,__n);
                memcpy(__dest_00,b_04,__n);
                memcpy(__dest_01,b_05,__n);
                palVar27 = __dest_02;
                memcpy(__dest_02,b_06,__n);
                local_22c = (int)uVar31;
              }
              iVar16 = (int)palVar27;
              uVar31 = uVar31 + 1;
              local_170 = local_170 + 4;
              local_178 = local_178 + 4;
            } while (uVar31 != uVar19);
            lVar20 = 0;
            iVar17 = 0;
            if ((uVar29 & 0x7ffffffe) == 0) {
              iVar24 = 0;
              iVar22 = 0;
            }
            else {
              iVar16 = (uVar7 & 0x3fffffff) * 2;
              uVar29 = 0;
              lVar23 = 0;
              lVar25 = 0;
              do {
                if ((*__dest)[uVar29] == local_208) {
                  uVar30 = 0;
                  if ((uVar29 & 1) != 0) {
                    uVar30 = uVar7;
                  }
                  uVar30 = uVar30 + ((uint)(uVar29 >> 1) & 0x7fffffff);
                  if ((int)uVar30 < (int)uVar13) {
                    lVar20 = (*__dest_00)[uVar29];
                    lVar25 = (*__dest_01)[uVar29];
                    lVar23 = (*__dest_02)[uVar29];
                    uVar13 = (ulong)uVar30;
                  }
                }
                iVar22 = (int)lVar23;
                iVar24 = (int)lVar25;
                iVar17 = (int)lVar20;
                uVar30 = (uint)uVar13;
                uVar29 = uVar29 + 1;
              } while (iVar16 != (int)uVar29);
            }
            iVar12 = (int)local_208;
            auVar48._8_4_ = (int)uVar32;
            auVar48._0_8_ = uVar32;
            auVar48._12_4_ = (int)(uVar32 >> 0x20);
            auVar53._0_8_ = -(ulong)((long)uVar32 < (long)local_128._0_8_);
            auVar53._8_8_ = -(ulong)(auVar48._8_8_ < (long)local_128._8_8_);
            auVar49._8_4_ = 0xffffffff;
            auVar49._0_8_ = 0xffffffffffffffff;
            auVar49._12_4_ = 0xffffffff;
            auVar54._8_4_ = (int)len;
            auVar54._0_8_ = len;
            auVar54._12_4_ = uVar50;
            auVar60._0_8_ = -(ulong)((long)len < (long)local_168._0_8_);
            auVar60._8_8_ = -(ulong)(auVar54._8_8_ < (long)local_168._8_8_);
            iVar16 = movmskpd(iVar16,auVar60 | auVar49 ^ auVar53);
            if (iVar16 != 0) {
              *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
              iVar12 = 0;
              iVar17 = 0;
              iVar24 = 0;
              iVar22 = 0;
              local_22c = 0;
              uVar30 = 0;
            }
            ppVar14->score = iVar12;
            ppVar14->end_query = uVar30;
            ppVar14->end_ref = local_22c;
            ((ppVar14->field_4).stats)->matches = iVar17;
            ((ppVar14->field_4).stats)->similar = iVar24;
            ((ppVar14->field_4).stats)->length = iVar22;
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(__dest_02);
            parasail_free(__dest_01);
            parasail_free(__dest_00);
            parasail_free(__dest);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(b_00);
            parasail_free(b);
            return ppVar14;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i case0;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            case0 = _mm_cmpeq_epi64(vH, vZero);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm_blendv_epi8(vHM, vZero, case0);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm_blendv_epi8(vHS, vZero, case0);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm_blendv_epi8(vHL, vZero, case0);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m128i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m128i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            __m128i vHM = _mm_load_si128(pvHM + offset);
            __m128i vHS = _mm_load_si128(pvHS + offset);
            __m128i vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int64_t *t = (int64_t*)pvHMax;
        int64_t *m = (int64_t*)pvHMMax;
        int64_t *s = (int64_t*)pvHSMax;
        int64_t *l = (int64_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}